

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

bool __thiscall slang::ast::BinaryAssertionExpr::admitsEmptyImpl(BinaryAssertionExpr *this)

{
  bool bVar1;
  bool bVar2;
  
  switch(this->op) {
  case And:
  case Intersect:
  case Within:
    bVar1 = AssertionExpr::admitsEmpty(this->left);
    if (bVar1) goto switchD_0039eb43_caseD_3;
  default:
    bVar1 = false;
    break;
  case Or:
    bVar2 = AssertionExpr::admitsEmpty(this->left);
    bVar1 = true;
    if (!bVar2) goto switchD_0039eb43_caseD_3;
    break;
  case Throughout:
switchD_0039eb43_caseD_3:
    bVar1 = AssertionExpr::admitsEmpty(this->right);
    return bVar1;
  }
  return bVar1;
}

Assistant:

bool BinaryAssertionExpr::admitsEmptyImpl() const {
    switch (op) {
        case BinaryAssertionOperator::Or:
            return left.admitsEmpty() || right.admitsEmpty();
        case BinaryAssertionOperator::And:
        case BinaryAssertionOperator::Intersect:
        case BinaryAssertionOperator::Within:
            return left.admitsEmpty() && right.admitsEmpty();
        case BinaryAssertionOperator::Throughout:
            return right.admitsEmpty();
        default:
            return false;
    }
}